

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderOperatorTests.cpp
# Opt level: O2

void deqp::gles3::Functional::eval_selection_bvec3(ShaderEvalContext *c)

{
  float fVar1;
  tcu *v;
  tcu local_81 [3];
  tcu local_7e [3];
  Vector<bool,_3> local_7b;
  Vector<float,_3> local_78;
  Vector<float,_3> local_68;
  Vector<float,_3> local_58;
  Vector<float,_3> local_48;
  Vector<float,_3> local_3c;
  VecAccess<float,_4,_3> local_30;
  
  fVar1 = c->in[0].m_data[2];
  local_58.m_data[2] = c->in[1].m_data[0];
  local_58.m_data._0_8_ = *(undefined8 *)(c->in[1].m_data + 1);
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 0.0;
  tcu::greaterThan<float,3>(local_7e,&local_58,&local_68);
  local_48.m_data[0] = c->in[2].m_data[3];
  local_48.m_data._4_8_ = *(undefined8 *)(c->in[2].m_data + 1);
  local_78.m_data[0] = 0.0;
  local_78.m_data[1] = 0.0;
  local_78.m_data[2] = 0.0;
  tcu::greaterThan<float,3>(local_81,&local_48,&local_78);
  v = local_81;
  if (0.0 < fVar1) {
    v = local_7e;
  }
  tcu::Vector<bool,_3>::Vector(&local_7b,(Vector<bool,_3> *)v);
  tcu::Vector<bool,_3>::cast<float>((Vector<bool,_3> *)&local_3c);
  local_30.m_vector = &c->color;
  local_30.m_index[0] = 0;
  local_30.m_index[1] = 1;
  local_30.m_index[2] = 2;
  tcu::VecAccess<float,_4,_3>::operator=(&local_30,&local_3c);
  return;
}

Assistant:

void eval_selection_bvec3	(ShaderEvalContext& c) { c.color.xyz()	= selection(c.in[0].z() > 0.0f,			greaterThan(c.in[1].swizzle(1, 2, 0), Vec3(0.0f, 0.0f, 0.0f)),			greaterThan(c.in[2].swizzle(3, 1, 2), Vec3(0.0f, 0.0f, 0.0f))).asFloat(); }